

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_text(nk_command_buffer *out,nk_rect *bounds,nk_rect *content,nk_flags state,
                        nk_style_button *style,char *txt,int len,nk_flags text_alignment,
                        nk_user_font *font)

{
  nk_flags in_ECX;
  nk_text *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  nk_user_font *in_R8;
  nk_command_buffer *unaff_retaddr;
  nk_rect in_stack_00000008;
  nk_style_item *background;
  nk_text text;
  nk_style_button *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  nk_rect *in_stack_ffffffffffffffb8;
  nk_command_buffer *in_stack_ffffffffffffffc0;
  int len_00;
  
  len_00 = (int)((ulong)in_RSI >> 0x20);
  nk_draw_button(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (nk_flags)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  nk_vec2(0.0,0.0);
  nk_widget_text(unaff_retaddr,in_stack_00000008,in_RDI,len_00,in_RDX,in_ECX,in_R8);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_text(struct nk_command_buffer *out,
const struct nk_rect *bounds, const struct nk_rect *content, nk_flags state,
const struct nk_style_button *style, const char *txt, int len,
nk_flags text_alignment, const struct nk_user_font *font)
{
struct nk_text text;
const struct nk_style_item *background;
background = nk_draw_button(out, bounds, state, style);

/* select correct colors/images */
if (background->type == NK_STYLE_ITEM_COLOR)
text.background = background->data.color;
else text.background = style->text_background;
if (state & NK_WIDGET_STATE_HOVER)
text.text = style->text_hover;
else if (state & NK_WIDGET_STATE_ACTIVED)
text.text = style->text_active;
else text.text = style->text_normal;

text.padding = nk_vec2(0,0);
nk_widget_text(out, *content, txt, len, &text, text_alignment, font);
}